

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateClearingCode
          (StringFieldGenerator *this,Printer *printer)

{
  ulong uVar1;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  FieldDescriptor::default_value_string_abi_cxx11_(this->descriptor_);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    io::Printer::Print(printer,&this->variables_,
                       "if ($name$_ != $default_variable$) {\n  $name$_->assign(*$default_variable$);\n}\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "if ($name$_ != $default_variable$) {\n  $name$_->clear();\n}\n");
  }
  return;
}

Assistant:

void StringFieldGenerator::
GenerateClearingCode(io::Printer* printer) const {
  if (descriptor_->default_value_string().empty()) {
    printer->Print(variables_,
      "if ($name$_ != $default_variable$) {\n"
      "  $name$_->clear();\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "if ($name$_ != $default_variable$) {\n"
      "  $name$_->assign(*$default_variable$);\n"
      "}\n");
  }
}